

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractsingleroleserialiser.cpp
# Opt level: O3

void __thiscall
AbstractSingleRoleSerialiser::AbstractSingleRoleSerialiser
          (AbstractSingleRoleSerialiser *this,QAbstractItemModel *model,QObject *parent)

{
  AbstractStringSerialiserPrivate *this_00;
  
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00165878;
  this_00 = (AbstractStringSerialiserPrivate *)operator_new(0x38);
  AbstractStringSerialiserPrivate::AbstractStringSerialiserPrivate
            (this_00,&this->super_AbstractStringSerialiser);
  AbstractStringSerialiser::AbstractStringSerialiser
            (&this->super_AbstractStringSerialiser,this_00,parent);
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00165878;
  setRoleToSave(this,0);
  AbstractModelSerialiser::setModel((AbstractModelSerialiser *)this,model);
  return;
}

Assistant:

AbstractSingleRoleSerialiser::AbstractSingleRoleSerialiser(QAbstractItemModel *model, QObject *parent)
    : AbstractStringSerialiser(*new AbstractSingleRoleSerialiserPrivate(this), parent)
{
    AbstractSingleRoleSerialiser::setRoleToSave(Qt::DisplayRole);
    setModel(model);
}